

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_child_item(Fl_Tree_Item *this,char *name)

{
  uint uVar1;
  Fl_Tree_Item **ppFVar2;
  Fl_Tree_Item *pFVar3;
  char *__s1;
  int iVar4;
  ulong uVar5;
  
  if (name != (char *)0x0) {
    uVar1 = (this->_children)._total;
    ppFVar2 = (this->_children)._items;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      pFVar3 = ppFVar2[uVar5];
      __s1 = pFVar3->_label;
      if ((__s1 != (char *)0x0) && (iVar4 = strcmp(__s1,name), iVar4 == 0)) {
        return pFVar3;
      }
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

const Fl_Tree_Item* Fl_Tree_Item::find_child_item(const char *name) const {
  if ( name )
    for ( int t=0; t<children(); t++ )
      if ( child(t)->label() )
        if ( strcmp(child(t)->label(), name) == 0 )
          return(child(t));
  return(0);
}